

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Prepare(sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pReprepare,
                  sqlite3_stmt **ppStmt,char **pzTail)

{
  u8 uVar1;
  Btree *pBVar2;
  sqlite3 *db_00;
  Vdbe *pVVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  TriggerPrg *p;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  size_t __n;
  bool bVar11;
  char *zErrMsg;
  int cookie;
  Parse sParse;
  TriggerPrg *local_298;
  u32 local_290;
  u32 local_28c;
  sqlite3_stmt **local_288;
  Parse local_280;
  
  local_298 = (TriggerPrg *)0x0;
  local_288 = ppStmt;
  memset(&local_280,0,0xc4);
  memset(&local_280.sLastToken,0,0x90);
  if ((prepFlags & 1) != 0) {
    local_280.disableLookaside = '\x01';
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
  }
  iVar5 = db->nDb;
  local_290 = prepFlags;
  local_280.pReprepare = pReprepare;
  if (0 < iVar5) {
    lVar9 = 0;
    lVar7 = 0;
    do {
      pBVar2 = *(Btree **)((long)&db->aDb->pBt + lVar9);
      if (pBVar2 != (Btree *)0x0) {
        if ((pBVar2->sharable != '\0') &&
           (pBVar2->wantToLock = pBVar2->wantToLock + 1, pBVar2->locked == '\0')) {
          btreeLockCarefully(pBVar2);
        }
        uVar4 = querySharedCacheTableLock(pBVar2,1,'\x01');
        if (pBVar2->sharable != '\0') {
          piVar8 = &pBVar2->wantToLock;
          *piVar8 = *piVar8 + -1;
          if (*piVar8 == 0) {
            unlockBtreeMutex(pBVar2);
          }
        }
        if (uVar4 != 0) {
          sqlite3ErrorWithMsg(db,uVar4,"database schema is locked: %s",
                              *(undefined8 *)((long)&db->aDb->zDbSName + lVar9));
          goto LAB_0021e199;
        }
        iVar5 = db->nDb;
      }
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 0x20;
    } while (lVar7 < iVar5);
  }
  sqlite3VtabUnlockList(db);
  local_280.db = db;
  if ((nBytes < 0) || ((uVar10 = (ulong)(uint)nBytes, nBytes != 0 && (zSql[uVar10 - 1] == '\0')))) {
    sqlite3RunParser(&local_280,zSql,(char **)&local_298);
  }
  else {
    if (db->aLimit[1] < nBytes) {
      sqlite3ErrorWithMsg(db,0x12,"statement too long");
      if (db->mallocFailed == '\0') {
        uVar4 = db->errMask & 0x12;
      }
      else {
        apiOomError(db);
        uVar4 = 7;
      }
      goto LAB_0021e199;
    }
    if ((zSql == (char *)0x0) ||
       (pcVar6 = (char *)sqlite3DbMallocRawNN(db,uVar10 + 1), pcVar6 == (char *)0x0)) {
      local_280.zTail = zSql + uVar10;
    }
    else {
      memcpy(pcVar6,zSql,uVar10);
      pcVar6[uVar10] = '\0';
      sqlite3RunParser(&local_280,pcVar6,(char **)&local_298);
      local_280.zTail = zSql + ((long)local_280.zTail - (long)pcVar6);
      sqlite3DbFreeNN(db,pcVar6);
    }
  }
  db_00 = local_280.db;
  if (local_280.rc == 0x65) {
    local_280.rc = 0;
  }
  if ((local_280.checkSchema != '\0') && (0 < (local_280.db)->nDb)) {
    lVar7 = 0;
    lVar9 = 0;
    do {
      pBVar2 = *(Btree **)((long)&db_00->aDb->pBt + lVar7);
      if (pBVar2 != (Btree *)0x0) {
        uVar1 = pBVar2->inTrans;
        if ((uVar1 == '\0') && (iVar5 = sqlite3BtreeBeginTrans(pBVar2,0), iVar5 != 0)) {
          if (((iVar5 == 0xc0a) || (iVar5 == 7)) &&
             ((db_00->mallocFailed == '\0' && (db_00->bBenignMalloc == '\0')))) {
            db_00->mallocFailed = '\x01';
            if (0 < db_00->nVdbeExec) {
              (db_00->u1).isInterrupted = 1;
            }
            (db_00->lookaside).bDisable = (db_00->lookaside).bDisable + 1;
          }
          break;
        }
        sqlite3BtreeGetMeta(pBVar2,1,&local_28c);
        if (local_28c != **(u32 **)((long)&db_00->aDb->pSchema + lVar7)) {
          sqlite3ResetOneSchema(db_00,(int)lVar9);
          local_280.rc = 0x11;
        }
        if (uVar1 == '\0') {
          sqlite3BtreeCommit(pBVar2);
        }
      }
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + 0x20;
    } while (lVar9 < db_00->nDb);
  }
  if (db->mallocFailed != '\0') {
    local_280.rc = 7;
  }
  uVar4 = local_280.rc;
  if (pzTail != (char **)0x0) {
    *pzTail = local_280.zTail;
  }
  if ((local_280.explain != '\0' && local_280.pVdbe != (Vdbe *)0x0) && local_280.rc == 0) {
    bVar11 = local_280.explain == '\x02';
    uVar10 = (ulong)((uint)bVar11 * 8);
    sqlite3VdbeSetNumCols(local_280.pVdbe,(uint)!bVar11 * 4 + 4);
    piVar8 = (int *)(sqlite3Prepare_azColName_rel + (ulong)bVar11 * 0x20);
    lVar7 = 0;
    do {
      if ((local_280.pVdbe)->db->mallocFailed == '\0') {
        sqlite3VdbeMemSetStr
                  ((Mem *)((long)&(local_280.pVdbe)->aColName->u + lVar7),
                   sqlite3Prepare_azColName_rel + *piVar8,-1,'\x01',(_func_void_void_ptr *)0x0);
      }
      uVar10 = uVar10 + 1;
      piVar8 = piVar8 + 1;
      lVar7 = lVar7 + 0x38;
    } while (uVar10 < (ulong)bVar11 * 4 + 8);
  }
  pVVar3 = local_280.pVdbe;
  if ((db->init).busy == '\0') {
    if (local_280.pVdbe != (Vdbe *)0x0) {
      (local_280.pVdbe)->prepFlags = (u8)local_290;
      if (-1 < (char)(u8)local_290) {
        (local_280.pVdbe)->expmask = 0;
      }
      if (zSql == (char *)0x0) {
LAB_0021e0f1:
        pcVar6 = (char *)0x0;
      }
      else {
        __n = (size_t)((int)local_280.zTail - (int)zSql);
        pcVar6 = (char *)sqlite3DbMallocRawNN((local_280.pVdbe)->db,__n + 1);
        if (pcVar6 == (char *)0x0) goto LAB_0021e0f1;
        memcpy(pcVar6,zSql,__n);
        pcVar6[__n] = '\0';
      }
      pVVar3->zSql = pcVar6;
      goto LAB_0021e100;
    }
LAB_0021e11a:
    local_280.pVdbe = (Vdbe *)0x0;
LAB_0021e11d:
    *local_288 = (sqlite3_stmt *)local_280.pVdbe;
  }
  else {
LAB_0021e100:
    if (local_280.pVdbe == (Vdbe *)0x0) goto LAB_0021e11a;
    if ((uVar4 == 0) && (db->mallocFailed == '\0')) goto LAB_0021e11d;
    sqlite3VdbeFinalize(local_280.pVdbe);
  }
  p = local_298;
  if (local_298 == (TriggerPrg *)0x0) {
    db->errCode = uVar4;
    if ((uVar4 == 0) && (db->pErr == (sqlite3_value *)0x0)) goto LAB_0021e18c;
    sqlite3ErrorFinish(db,uVar4);
    goto LAB_0021e18c;
  }
  sqlite3ErrorWithMsg(db,uVar4,"%s",local_298);
  while( true ) {
    sqlite3DbFreeNN(db,p);
LAB_0021e18c:
    if (local_280.pTriggerPrg == (TriggerPrg *)0x0) break;
    p = local_280.pTriggerPrg;
    local_280.pTriggerPrg = (local_280.pTriggerPrg)->pNext;
  }
LAB_0021e199:
  sqlite3ParserReset(&local_280);
  if ((uVar4 == 0xc0a) || (db->mallocFailed != '\0')) {
    apiOomError(db);
    uVar4 = 7;
  }
  else {
    uVar4 = uVar4 & db->errMask;
  }
  return uVar4;
}

Assistant:

static int sqlite3Prepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pReprepare,         /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  char *zErrMsg = 0;        /* Error message */
  int rc = SQLITE_OK;       /* Result code */
  int i;                    /* Loop counter */
  Parse sParse;             /* Parsing context */

  memset(&sParse, 0, PARSE_HDR_SZ);
  memset(PARSE_TAIL(&sParse), 0, PARSE_TAIL_SZ);
  sParse.pReprepare = pReprepare;
  assert( ppStmt && *ppStmt==0 );
  /* assert( !db->mallocFailed ); // not true with SQLITE_USE_ALLOCA */
  assert( sqlite3_mutex_held(db->mutex) );

  /* For a long-term use prepared statement avoid the use of
  ** lookaside memory.
  */
  if( prepFlags & SQLITE_PREPARE_PERSISTENT ){
    sParse.disableLookaside++;
    db->lookaside.bDisable++;
  }

  /* Check to verify that it is possible to get a read lock on all
  ** database schemas.  The inability to get a read lock indicates that
  ** some other database connection is holding a write-lock, which in
  ** turn means that the other connection has made uncommitted changes
  ** to the schema.
  **
  ** Were we to proceed and prepare the statement against the uncommitted
  ** schema changes and if those schema changes are subsequently rolled
  ** back and different changes are made in their place, then when this
  ** prepared statement goes to run the schema cookie would fail to detect
  ** the schema change.  Disaster would follow.
  **
  ** This thread is currently holding mutexes on all Btrees (because
  ** of the sqlite3BtreeEnterAll() in sqlite3LockAndPrepare()) so it
  ** is not possible for another thread to start a new schema change
  ** while this routine is running.  Hence, we do not need to hold 
  ** locks on the schema, we just need to make sure nobody else is 
  ** holding them.
  **
  ** Note that setting READ_UNCOMMITTED overrides most lock detection,
  ** but it does *not* override schema lock detection, so this all still
  ** works even if READ_UNCOMMITTED is set.
  */
  for(i=0; i<db->nDb; i++) {
    Btree *pBt = db->aDb[i].pBt;
    if( pBt ){
      assert( sqlite3BtreeHoldsMutex(pBt) );
      rc = sqlite3BtreeSchemaLocked(pBt);
      if( rc ){
        const char *zDb = db->aDb[i].zDbSName;
        sqlite3ErrorWithMsg(db, rc, "database schema is locked: %s", zDb);
        testcase( db->flags & SQLITE_ReadUncommit );
        goto end_prepare;
      }
    }
  }

  sqlite3VtabUnlockList(db);

  sParse.db = db;
  if( nBytes>=0 && (nBytes==0 || zSql[nBytes-1]!=0) ){
    char *zSqlCopy;
    int mxLen = db->aLimit[SQLITE_LIMIT_SQL_LENGTH];
    testcase( nBytes==mxLen );
    testcase( nBytes==mxLen+1 );
    if( nBytes>mxLen ){
      sqlite3ErrorWithMsg(db, SQLITE_TOOBIG, "statement too long");
      rc = sqlite3ApiExit(db, SQLITE_TOOBIG);
      goto end_prepare;
    }
    zSqlCopy = sqlite3DbStrNDup(db, zSql, nBytes);
    if( zSqlCopy ){
      sqlite3RunParser(&sParse, zSqlCopy, &zErrMsg);
      sParse.zTail = &zSql[sParse.zTail-zSqlCopy];
      sqlite3DbFree(db, zSqlCopy);
    }else{
      sParse.zTail = &zSql[nBytes];
    }
  }else{
    sqlite3RunParser(&sParse, zSql, &zErrMsg);
  }
  assert( 0==sParse.nQueryLoop );

  if( sParse.rc==SQLITE_DONE ) sParse.rc = SQLITE_OK;
  if( sParse.checkSchema ){
    schemaIsValid(&sParse);
  }
  if( db->mallocFailed ){
    sParse.rc = SQLITE_NOMEM_BKPT;
  }
  if( pzTail ){
    *pzTail = sParse.zTail;
  }
  rc = sParse.rc;

#ifndef SQLITE_OMIT_EXPLAIN
  if( rc==SQLITE_OK && sParse.pVdbe && sParse.explain ){
    static const char * const azColName[] = {
       "addr", "opcode", "p1", "p2", "p3", "p4", "p5", "comment",
       "selectid", "order", "from", "detail"
    };
    int iFirst, mx;
    if( sParse.explain==2 ){
      sqlite3VdbeSetNumCols(sParse.pVdbe, 4);
      iFirst = 8;
      mx = 12;
    }else{
      sqlite3VdbeSetNumCols(sParse.pVdbe, 8);
      iFirst = 0;
      mx = 8;
    }
    for(i=iFirst; i<mx; i++){
      sqlite3VdbeSetColName(sParse.pVdbe, i-iFirst, COLNAME_NAME,
                            azColName[i], SQLITE_STATIC);
    }
  }
#endif

  if( db->init.busy==0 ){
    sqlite3VdbeSetSql(sParse.pVdbe, zSql, (int)(sParse.zTail-zSql), prepFlags);
  }
  if( sParse.pVdbe && (rc!=SQLITE_OK || db->mallocFailed) ){
    sqlite3VdbeFinalize(sParse.pVdbe);
    assert(!(*ppStmt));
  }else{
    *ppStmt = (sqlite3_stmt*)sParse.pVdbe;
  }

  if( zErrMsg ){
    sqlite3ErrorWithMsg(db, rc, "%s", zErrMsg);
    sqlite3DbFree(db, zErrMsg);
  }else{
    sqlite3Error(db, rc);
  }

  /* Delete any TriggerPrg structures allocated while parsing this statement. */
  while( sParse.pTriggerPrg ){
    TriggerPrg *pT = sParse.pTriggerPrg;
    sParse.pTriggerPrg = pT->pNext;
    sqlite3DbFree(db, pT);
  }

end_prepare:

  sqlite3ParserReset(&sParse);
  rc = sqlite3ApiExit(db, rc);
  assert( (rc&db->errMask)==rc );
  return rc;
}